

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O0

ostream * Indexing::operator<<
                    (ostream *out,
                    Multiline<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_> *self)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *puVar4;
  type self_00;
  long *in_RSI;
  ostream *in_RDI;
  Multiline<Indexing::SubstitutionTree<Indexing::LiteralClause>_> MVar5;
  Symbol *f;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *t;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *__end0;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *__begin0;
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
  *__range2;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  Signature *in_stack_ffffffffffffff80;
  char *local_78;
  ostream *in_stack_ffffffffffffff98;
  uint indent;
  SubstitutionTree<Indexing::LiteralClause> *in_stack_ffffffffffffffa0;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *local_28;
  uint local_14;
  
  local_14 = 0;
  poVar3 = std::operator<<(in_RDI,"{ ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  lVar1 = *in_RSI;
  local_28 = Lib::
             Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
             ::begin((Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
                      *)(lVar1 + 8));
  puVar4 = Lib::
           Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
           ::end((Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
                  *)(lVar1 + 8));
  for (; local_28 != puVar4; local_28 = local_28 + 1) {
    std::
    unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
    ::operator->((unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                  *)0x341942);
    bVar2 = SubstitutionTree<Indexing::LiteralClause>::isEmpty
                      ((SubstitutionTree<Indexing::LiteralClause> *)in_stack_ffffffffffffff80);
    indent = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (!bVar2) {
      LiteralSubstitutionTree<Indexing::LiteralClause>::idxToFunctor(local_14);
      Kernel::Signature::getPredicate(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      Lib::Output::Multiline<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_>::
      outputIndent((ostream *)in_stack_ffffffffffffffa0,indent);
      in_stack_ffffffffffffff98 = in_RDI;
      bVar2 = LiteralSubstitutionTree<Indexing::LiteralClause>::idxIsNegative(local_14);
      if (bVar2) {
        local_78 = "~";
      }
      else {
        local_78 = " ";
      }
      std::operator<<(in_stack_ffffffffffffff98,local_78);
      poVar3 = Kernel::operator<<((ostream *)in_stack_ffffffffffffff80,
                                  (Symbol *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      in_stack_ffffffffffffff80 = (Signature *)std::operator<<(poVar3,"(");
      self_00 = std::
                unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                ::operator*((unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                             *)in_stack_ffffffffffffff80);
      MVar5 = Lib::Output::multiline<Indexing::SubstitutionTree<Indexing::LiteralClause>>
                        (self_00,(int)in_RSI[1] + 1);
      in_stack_ffffffffffffffa0 = MVar5.self;
      poVar3 = operator<<((ostream *)in_stack_ffffffffffffff80,
                          (Multiline<Indexing::SubstitutionTree<Indexing::LiteralClause>_> *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    local_14 = local_14 + 1;
  }
  poVar3 = std::operator<<(in_RDI,"} ");
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Output::Multiline<LiteralSubstitutionTree<LeafData_>> const& self)
  { 
    int i = 0;
    out << "{ " << std::endl;
    for (auto& t : self.self._trees) {
      if (!t->isEmpty()) {
        auto f = env.signature->getPredicate(idxToFunctor(i));
        Output::Multiline<LiteralSubstitutionTree>::outputIndent(out, self.indent);
        out << (idxIsNegative(i) ? "~" : " ") << *f << "(" << Output::multiline(*t, self.indent + 1) << ")" << std::endl; 
      }
      i++;
    }
    return out << "} ";
  }